

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O1

bool __thiscall KDReports::Report::exportToFile(Report *this,QString *fileName,QWidget *parent)

{
  bool bVar1;
  QPrinter printer;
  QString QStack_58;
  QArrayDataPointer<char16_t> local_38;
  
  ReportPrivate::ensureLayouted
            ((this->d)._M_t.
             super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
             .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl);
  QPrinter::QPrinter((QPrinter *)&QStack_58,0);
  QPrinter::setOutputFileName(&QStack_58);
  setupPrinter(this,(QPrinter *)&QStack_58);
  bVar1 = ReportPrivate::doPrint
                    ((this->d)._M_t.
                     super___uniq_ptr_impl<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_KDReports::ReportPrivate_*,_std::default_delete<KDReports::ReportPrivate>_>
                     .super__Head_base<0UL,_KDReports::ReportPrivate_*,_false>._M_head_impl,
                     (QPrinter *)&QStack_58,parent);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QPrinter::setOutputFileName(&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QPrinter::~QPrinter((QPrinter *)&QStack_58);
  return bVar1;
}

Assistant:

bool KDReports::Report::exportToFile(const QString &fileName, QWidget *parent)
{
    d->ensureLayouted();
    QPrinter printer;
    printer.setOutputFileName(fileName); // must be done before setupPrinter, since it affects DPI
    setupPrinter(&printer);
    const bool ret = d->doPrint(&printer, parent);
    printer.setOutputFileName(QString());
    return ret;
}